

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O0

ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer *buffer,ZydisTokenType type)

{
  ulong uVar1;
  void *pvVar2;
  ZyanUSize local_48;
  ZydisFormatterToken *token;
  ZyanUSize delta;
  ZydisFormatterToken *last;
  ZyanUSize len;
  ZydisTokenType type_local;
  ZydisFormatterBuffer *buffer_local;
  
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    buffer_local._4_4_ = 0x80100004;
  }
  else if (buffer->is_token_list == '\0') {
    buffer_local._4_4_ = 0x100000;
  }
  else {
    uVar1 = (buffer->string).vector.size;
    if ((uVar1 == 0) || (0xff < uVar1)) {
      __assert_fail("(len > 0) && (len < 256)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                    ,0x7c,
                    "ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer *, ZydisTokenType)")
      ;
    }
    if (uVar1 + 2 < buffer->capacity) {
      *(char *)((long)(buffer->string).vector.data + -1) = (char)uVar1;
      buffer->capacity = buffer->capacity - (uVar1 + 2);
      (buffer->string).vector.data = (void *)((long)(buffer->string).vector.data + uVar1 + 2);
      (buffer->string).vector.size = 1;
      if (buffer->capacity < 0xff) {
        local_48 = buffer->capacity;
      }
      else {
        local_48 = 0xff;
      }
      (buffer->string).vector.capacity = local_48;
      *(undefined1 *)(buffer->string).vector.data = 0;
      pvVar2 = (buffer->string).vector.data;
      *(ZydisTokenType *)((long)pvVar2 + -2) = type;
      *(undefined1 *)((long)pvVar2 + -1) = 0;
      buffer_local._4_4_ = 0x100000;
    }
    else {
      buffer_local._4_4_ = 0x80100009;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterBufferAppend(ZydisFormatterBuffer* buffer, ZydisTokenType type)
{
    if (!buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!buffer->is_token_list)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    const ZyanUSize len = buffer->string.vector.size;
    ZYAN_ASSERT((len > 0) && (len < 256));
    if (buffer->capacity <= len + sizeof(ZydisFormatterToken))
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZydisFormatterToken* const last  = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    last->next = (ZyanU8)len;

    const ZyanUSize delta = len + sizeof(ZydisFormatterToken);
    buffer->capacity -= delta;
    buffer->string.vector.data = (ZyanU8*)buffer->string.vector.data + delta;
    buffer->string.vector.size = 1;
    buffer->string.vector.capacity = ZYAN_MIN(buffer->capacity, 255);
    *(char*)buffer->string.vector.data = '\0';

    ZydisFormatterToken* const token = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    token->type = type;
    token->next = 0;

    return ZYAN_STATUS_SUCCESS;
}